

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O3

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::
set_display_type(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this,
                DisplayType display_type)

{
  atomic_flag *paVar1;
  __atomic_flag_data_type _Var2;
  HalfCycles duration;
  unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  local_28;
  
  LOCK();
  paVar1 = &(this->video_).flush_concurrency_check_;
  _Var2 = (paVar1->super___atomic_flag_base)._M_i;
  (paVar1->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  if (_Var2 == false) {
    if ((this->video_).is_flushed_ == false) {
      (this->video_).is_flushed_ = true;
      (this->video_).did_flush_ = true;
      duration.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>::run_for
                (&(this->video_).object_,duration);
    }
    LOCK();
    (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    local_28._M_t.
    super___uniq_ptr_impl<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>_*,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>_*,_false>
    ._M_head_impl = &(this->video_).object_;
    local_28._M_t.
    super___uniq_ptr_impl<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>_*,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
            )&this->video_;
    Outputs::CRT::CRT::set_display_type(&(this->video_).object_.crt_,display_type);
    std::
    unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr(&local_28);
    return;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Sinclair/ZXSpectrum/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<Sinclair::ZXSpectrum::Video::Timing::Plus3>>::operator->() [T = Sinclair::ZXSpectrum::Video::Video<Sinclair::ZXSpectrum::Video::Timing::Plus3>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

void set_display_type(Outputs::Display::DisplayType display_type) override {
			video_->set_display_type(display_type);
		}